

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void movntq_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  ulong uVar2;
  uint uVar3;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      UVar1 = (pMyDisasm->Reserved_).EVEX.state;
      if (UVar1 == '\x01') {
        if ((pMyDisasm->Reserved_).EVEX.W == '\x01') goto LAB_00127eb8;
        (pMyDisasm->Instruction).Category = 0x140000;
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
      }
      else {
        (pMyDisasm->Instruction).Category = 0x110000;
      }
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovntdq",9);
      if (UVar1 == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
      }
      vex_ExGx(pMyDisasm);
      return;
    }
  }
  else {
    uVar2 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar2 != 0) && (uVar2 < (pMyDisasm->Reserved_).EIP_ + 2)) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
      return;
    }
    uVar3 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar3;
    if (uVar3 != 3) {
      if ((pMyDisasm->Prefix).OperandSize == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
        (pMyDisasm->Prefix).OperandSize = '\b';
        (pMyDisasm->Reserved_).MemDecoration = 9;
        (pMyDisasm->Instruction).Category = 0x50019;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movntdq",8);
        (pMyDisasm->Reserved_).Register_ = 4;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 4;
        (pMyDisasm->Instruction).Category = 0x40019;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movntq",7);
        (pMyDisasm->Reserved_).Register_ = 2;
      }
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      return;
    }
  }
LAB_00127eb8:
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ movntq_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 1)) {
        failDecode(pMyDisasm);
        return;
      }
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      if (GV.EVEX.state == InUsePrefix) {
        GV.EVEX.tupletype = FULL_MEM;
      }
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovntdq");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
      vex_ExGx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if (GV.MOD_== 0x3) {
      failDecode(pMyDisasm);
    }
     /* ========== 0x66 */
    else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg1_m128_xmm;
      pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movntdq");
      #endif
      GV.Register_ = SSE_REG;
      ExGx(pMyDisasm);

    }
    else {
      GV.MemDecoration = Arg1qword;
      pMyDisasm->Instruction.Category = SSE_INSTRUCTION+CACHEABILITY_CONTROL;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movntq");
      #endif
      GV.Register_ = MMX_REG;
      ExGx(pMyDisasm);
    }
  }
}